

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
ptc::Print<char>::
print_backend<std::ostream&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *first)

{
  size_type sVar1;
  int iVar2;
  ostream *os_00;
  undefined8 uVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar2 == 0) {
    sVar1 = (this->pattern)._M_string_length;
    if (sVar1 == 0) {
      anon_unknown_4::
      operator<<<std::map,_int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_char>
                (os,first);
    }
    else {
      os_00 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
      anon_unknown_4::
      operator<<<std::map,_int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_char>
                ((basic_ostream<char,_std::char_traits<char>_> *)os_00,first);
      std::__ostream_insert<char,std::char_traits<char>>
                (os_00,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
    if (this->flush == true) {
      std::ostream::flush();
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  _Unwind_Resume(uVar3);
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }